

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test::testBody
          (TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  StringEqualFailure f;
  TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"");
  StringEqualFailure::StringEqualFailure
            ((StringEqualFailure *)(local_a8 + 0x30),pUVar1,fileName,2,
             "StringWith\t\nDifferentString","StringWith\t\ndifferentString",
             (SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <StringWith\\t\\nDifferentString>\n\tbut was  <StringWith\\t\\ndifferentString>\n\tdifference starts at position 12 at: <ngWith\\t\\ndifferentS>\n\t                                                ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0xda,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  StringEqualFailure::~StringEqualFailure((StringEqualFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, StringsEqualFailureWithNewLinesAndTabs)
{
    StringEqualFailure f(test, failFileName, failLineNumber,
            "StringWith\t\nDifferentString",
            "StringWith\t\ndifferentString", "");

    FAILURE_EQUAL("expected <StringWith\\t\\nDifferentString>\n"
                "\tbut was  <StringWith\\t\\ndifferentString>\n"
                "\tdifference starts at position 12 at: <ngWith\\t\\ndifferentS>\n"
                "\t                                                ^", f);
}